

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_sei.c
# Opt level: O3

RK_S32 user_data_registered_itu_t_t35(HEVCContext *s,BitReadCtx_t *gb,int size)

{
  uint uVar1;
  uint uVar2;
  MPP_RET MVar3;
  int iVar4;
  RK_U32 hdr_fmt;
  RK_U8 *data;
  uint uVar5;
  RK_S32 _out;
  uint local_34;
  
  if (2 < size) {
    MVar3 = mpp_read_bits(gb,8,(RK_S32 *)&local_34);
    uVar1 = local_34;
    gb->ret = MVar3;
    if (MVar3 != MPP_OK) {
      return -0x3ec;
    }
    if ((local_34 != 0x26) && (local_34 != 0xb5)) {
      if (local_34 == 0xff) {
        MVar3 = mpp_skip_longbits(gb,8);
        gb->ret = MVar3;
        if (MVar3 != MPP_OK) {
          return -0x3ec;
        }
      }
      _mpp_log_l(4,"h265d_sei",
                 "Unsupported User Data Registered ITU-T T35 SEI message (country_code = %d)",
                 (char *)0x0,(ulong)local_34);
      return -0x3ec;
    }
    MVar3 = mpp_read_bits(gb,0x10,(RK_S32 *)&local_34);
    uVar2 = local_34;
    gb->ret = MVar3;
    if (MVar3 != MPP_OK) {
      return -0x3ec;
    }
    MVar3 = mpp_read_bits(gb,0x10,(RK_S32 *)&local_34);
    gb->ret = MVar3;
    if (MVar3 != MPP_OK) {
      return -0x3ec;
    }
    uVar5 = local_34 & 0xffff;
    if (((byte)h265d_debug & 0x20) != 0) {
      _mpp_log_l(4,"h265d_sei","country_code=%d provider_code=%d terminal_provider_code %d\n",
                 (char *)0x0,(ulong)uVar1,(ulong)uVar2,uVar5);
    }
    if (uVar2 == 0x3c) {
      MVar3 = mpp_read_bits(gb,8,(RK_S32 *)&local_34);
      gb->ret = MVar3;
      if (MVar3 != MPP_OK) {
        return -0x3ec;
      }
      if (uVar5 != 1) {
        return 0;
      }
      if ((char)local_34 != '\x04') {
        return 0;
      }
      iVar4 = mpp_get_bits_left(gb);
      data = gb->data_;
      hdr_fmt = 8;
    }
    else {
      if (uVar2 != 4) {
        return 0;
      }
      iVar4 = mpp_get_bits_left(gb);
      data = gb->data_;
      hdr_fmt = 5;
    }
    mpp_hevc_fill_dynamic_meta(s,data,iVar4 >> 3,hdr_fmt);
  }
  return 0;
}

Assistant:

static RK_S32 user_data_registered_itu_t_t35(HEVCContext *s, BitReadCtx_t *gb, int size)
{
    RK_S32 country_code, provider_code;
    RK_U16 provider_oriented_code;

    if (size < 3)
        return 0;

    READ_BITS(gb, 8, &country_code);
    if (country_code == 0xFF) {
        if (size < 1)
            return 0;

        SKIP_BITS(gb, 8);
    }

    /* usa country_code or china country_code */
    if (country_code != 0xB5 && country_code != 0x26) {
        mpp_log("Unsupported User Data Registered ITU-T T35 SEI message (country_code = %d)", country_code);
        return MPP_ERR_STREAM;
    }

    READ_BITS(gb, 16, &provider_code);
    READ_BITS(gb, 16, &provider_oriented_code);
    h265d_dbg(H265D_DBG_SEI, "country_code=%d provider_code=%d terminal_provider_code %d\n",
              country_code, provider_code, provider_oriented_code);
    switch (provider_code) {
    case 0x4: {/* cuva provider_code is 0x4 */
        vivid_display_info(s, gb, mpp_get_bits_left(gb) >> 3);
    } break;
    case 0x3c: {/* smpte2094_40 provider_code is 0x3c*/
        const RK_U16 smpte2094_40_provider_oriented_code = 0x0001;
        const RK_U8 smpte2094_40_application_identifier = 0x04;
        RK_U8 application_identifier;

        READ_BITS(gb, 8, &application_identifier);
        /* hdr10plus priverder_oriented_code is 0x0001, application_identifier is 0x04 */
        if (provider_oriented_code == smpte2094_40_provider_oriented_code &&
            application_identifier == smpte2094_40_application_identifier)
            hdr10plus_dynamic_data(s, gb, mpp_get_bits_left(gb) >> 3);
    } break;
    default:
        break;
    }

    return 0;

__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}